

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringTools.hpp
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* CLI::detail::split(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *__return_storage_ptr__,string *s,char delim)

{
  bool bVar1;
  ulong uVar2;
  istream *piVar3;
  undefined1 local_1d8 [8];
  string item;
  stringstream ss;
  char delim_local;
  string *s_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *elems;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(__return_storage_ptr__);
  uVar2 = ::std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    ::std::__cxx11::stringstream::stringstream((stringstream *)(item.field_2._M_local_buf + 8));
    ::std::__cxx11::stringstream::str((string *)(item.field_2._M_local_buf + 8));
    ::std::__cxx11::string::string((string *)local_1d8);
    while( true ) {
      piVar3 = ::std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)(item.field_2._M_local_buf + 8),(string *)local_1d8,delim);
      bVar1 = ::std::ios::operator_cast_to_bool
                        ((ios *)(piVar3 + *(long *)(*(long *)piVar3 + -0x18)));
      if (!bVar1) break;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(__return_storage_ptr__,(value_type *)local_1d8);
    }
    ::std::__cxx11::string::~string((string *)local_1d8);
    ::std::__cxx11::stringstream::~stringstream((stringstream *)(item.field_2._M_local_buf + 8));
  }
  else {
    ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[1]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               __return_storage_ptr__,(char (*) [1])0x12a1aa);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::vector<std::string> split(const std::string &s, char delim) {
    std::vector<std::string> elems;
    // Check to see if empty string, give consistent result
    if(s.empty())
        elems.emplace_back("");
    else {
        std::stringstream ss;
        ss.str(s);
        std::string item;
        while(std::getline(ss, item, delim)) {
            elems.push_back(item);
        }
    }
    return elems;
}